

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

void refs_down(refs_table_t *tbl,uint64_t a)

{
  int iVar1;
  int res;
  uint64_t a_local;
  refs_table_t *tbl_local;
  
  iVar1 = refs_modify(tbl,a,-1);
  if (iVar1 != 0) {
    return;
  }
  __assert_fail("res != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_refs.c"
                ,0x107,"void refs_down(refs_table_t *, uint64_t)");
}

Assistant:

void
refs_down(refs_table_t *tbl, uint64_t a)
{
#ifdef NDEBUG
    refs_modify(tbl, a, -1);
#else
    int res = refs_modify(tbl, a, -1);
    assert(res != 0);
#endif
}